

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O2

void __thiscall
EthBasePort::make_bread_packet
          (EthBasePort *this,quadlet_t *packet,nodeid_t node,nodeaddr_t addr,uint nBytes,uint tl)

{
  uint32_t uVar1;
  
  make_1394_header(this,packet,node,addr,5,tl);
  packet[3] = ((nBytes & 0xff00) << 8 | nBytes << 0x18) >> 0x10;
  uVar1 = crc32(0,packet,0x10);
  uVar1 = BitReverse32(uVar1);
  packet[4] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  return;
}

Assistant:

void EthBasePort::make_bread_packet(quadlet_t *packet, nodeid_t node, nodeaddr_t addr, unsigned int nBytes, unsigned int tl)
{
    make_1394_header(packet, node, addr, EthBasePort::BREAD, tl);
    packet[3] = bswap_32((nBytes & 0x0000ffff) << 16);
    // CRC
    packet[4] = bswap_32(BitReverse32(crc32(0U, (void*)packet, FW_BREAD_SIZE-FW_CRC_SIZE)));
}